

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  RtreeNode *pNode_00;
  int iCell_00;
  int iVar1;
  ulong uVar2;
  RtreeNode *pParent;
  int iVar3;
  int iCell;
  RtreeCell cell;
  int local_64;
  RtreeCell local_60;
  
  iVar3 = 0;
  do {
    pNode_00 = pNode->pParent;
    if (pNode_00 == (RtreeNode *)0x0) {
      return 0;
    }
    if ((iVar3 == 1000) ||
       (iVar1 = nodeParentIndex(pRtree,pNode,&local_64), iCell_00 = local_64, iVar1 != 0)) {
      return 0x10b;
    }
    iVar3 = iVar3 + 1;
    nodeGetCell(pRtree,pNode_00,local_64,&local_60);
    for (uVar2 = 0; pNode = pNode_00, uVar2 < pRtree->nDim2; uVar2 = uVar2 + 2) {
      if (pRtree->eCoordType == '\x01') {
        if ((pCell->aCoord[uVar2].i < local_60.aCoord[uVar2].i) ||
           (local_60.aCoord[uVar2 + 1].i < pCell->aCoord[uVar2 + 1].i)) goto LAB_001c79ee;
      }
      else if ((pCell->aCoord[uVar2].f <= local_60.aCoord[uVar2].f &&
                local_60.aCoord[uVar2].f != pCell->aCoord[uVar2].f) ||
              (local_60.aCoord[uVar2 + 1].f <= pCell->aCoord[uVar2 + 1].f &&
               pCell->aCoord[uVar2 + 1].f != local_60.aCoord[uVar2 + 1].f)) {
LAB_001c79ee:
        cellUnion(pRtree,&local_60,pCell);
        nodeOverwriteCell(pRtree,pNode_00,&local_60,iCell_00);
        break;
      }
    }
  } while( true );
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  int cnt = 0;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    if( (++cnt)>1000 || nodeParentIndex(pRtree, p, &iCell)  ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }
 
    p = pParent;
  }
  return SQLITE_OK;
}